

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_StoPrint(Nf_Man_t *p,int fVerbose)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  lVar3 = (long)p->vTt2Match->nSize;
  uVar4 = 0;
  if (2 < lVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      iVar1 = *(int *)((long)&p->vTt2Match->pArray[2].nSize + lVar5);
      uVar2 = uVar6 + 1 + (iVar1 - 2U >> 1);
      if (iVar1 < 2) {
        uVar2 = uVar6;
      }
      uVar6 = uVar2;
      uVar4 = (ulong)uVar6;
      lVar5 = lVar5 + 0x10;
    } while (lVar3 * 0x10 + -0x20 != lVar5);
  }
  printf("Gates = %d.  Truths = %d.  Matches = %d.\n",(ulong)(uint)p->nCells,
         (ulong)(uint)p->vTtMem->nEntries,uVar4);
  return;
}

Assistant:

void Nf_StoPrint( Nf_Man_t * p, int fVerbose )
{
    int t, i, GateId, Entry, Count = 0;
    for ( t = 2; t < Vec_WecSize(p->vTt2Match); t++ )
    {
        Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, t );
        Vec_IntForEachEntryDouble( vArr, GateId, Entry, i )
        {
            Count++;
            if ( !fVerbose )
                continue;
            //if ( t < 10 )
            //    Nf_StoPrintOne( p, Count, t, i/2, GateId, Pf_Int2Mat(Entry) );
        }
    }
    printf( "Gates = %d.  Truths = %d.  Matches = %d.\n", 
        p->nCells, Vec_MemEntryNum(p->vTtMem), Count );
}